

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O1

void __thiscall
pstack::Procman::CodeLocation::CodeLocation(CodeLocation *this,sptr *info,Phdr *phdr,Addr off)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->location_ = off;
  (this->dwarf_).super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (info->super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->dwarf_).super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (info->super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (info->super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->dwarf_).super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  (info->super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->phdr_ = phdr;
  this->cie_ = (CIE *)0x0;
  this->fde_ = (FDE *)0x0;
  this->cfi_ = (CFI *)0x0;
  pstack::Dwarf::CallFrame::CallFrame(&this->frame_);
  (this->die_).raw.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->die_).unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->die_).offset = 0;
  (this->die_).raw.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->die_).unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->symbol_).
  super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_engaged = false;
  return;
}

Assistant:

CodeLocation::CodeLocation(Dwarf::Info::sptr info, const Elf::Phdr *phdr, Elf::Addr off)
    : location_(off)
    , dwarf_(std::move(info)), phdr_(phdr), cie_(nullptr), fde_(nullptr), cfi_(nullptr)
{
}